

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O1

promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
* __thiscall
ising::free_energy::square::
finite_count<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
          (promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
           *__return_storage_ptr__,square *this,uint Lx,uint Ly,double Jx,double Jy,
          fvar<double,_2UL> beta,
          fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> h)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> fVar5;
  undefined8 *puVar6;
  double *pdVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  fvar<double,_2UL> *pfVar11;
  invalid_argument *piVar12;
  undefined4 in_register_0000000c;
  ulong uVar13;
  ulong uVar14;
  DenseStorage<long,__1,__1,__1,_0> *pDVar15;
  fvar<double,_2UL> *pfVar16;
  undefined4 in_register_00000014;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul> *this_00;
  int iVar17;
  long lVar18;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul> *pfVar19;
  int_t c;
  uint uVar20;
  uint uVar21;
  value_type_conflict3 *__val;
  bool bVar22;
  byte bVar23;
  double dVar24;
  undefined8 in_XMM0_Qb;
  root_type d0;
  span_t span;
  basis basis;
  unitcell unitcell;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> mcr;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> retval_1;
  graph local_248;
  undefined1 local_1f8 [16];
  double local_1e8;
  fvar<double,_2UL> *local_1e0;
  anon_class_8_1_3fcf650a local_1d8;
  double local_1d0;
  DenseStorage<long,__1,__1,__1,_0> local_1c8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined1 local_178 [16];
  basis local_168;
  unitcell local_150;
  undefined1 local_118 [16];
  undefined1 local_108 [72];
  promote<fvar<fvar<double,_2UL>,_2UL>,_fvar<double,_2UL>_> local_c0;
  double local_78 [9];
  
  fVar5.v._M_elems[0].v._M_elems = h.v._M_elems[0].v._M_elems;
  bVar23 = 0;
  local_1f8._8_8_ = in_XMM0_Qb;
  local_1f8._0_8_ = Jx;
  iVar17 = (int)this;
  if ((iVar17 == 0) || (Lx == 0)) {
    piVar12 = (invalid_argument *)
              __cxa_allocate_exception
                        (0x10,this,CONCAT44(in_register_00000014,Lx),
                         CONCAT44(in_register_0000000c,Ly));
    std::invalid_argument::invalid_argument(piVar12,"Lx and Ly should be positive");
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lattice::basis::simple(&local_168,2);
  local_150.dim_ = 2;
  local_150.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_150.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_150.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.dim_ = 0;
  local_248.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  free((void *)0x0);
  puVar6 = (undefined8 *)malloc(0x10);
  if (puVar6 == (undefined8 *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = dup2;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_248.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  *puVar6 = 0;
  puVar6[1] = 0;
  local_248.dim_ = (size_t)puVar6;
  lattice::unitcell::add_site(&local_150,(coordinate_t *)&local_248,0);
  free((void *)local_248.dim_);
  local_248.dim_ = 0;
  local_248.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  free((void *)0x0);
  puVar6 = (undefined8 *)malloc(0x10);
  if (puVar6 == (undefined8 *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = dup2;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_248.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  *puVar6 = 1;
  puVar6[1] = 0;
  local_248.dim_ = (size_t)puVar6;
  lattice::unitcell::add_bond(&local_150,0,0,(offset_t *)&local_248,0);
  free((void *)local_248.dim_);
  local_248.dim_ = 0;
  local_248.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  free((void *)0x0);
  puVar6 = (undefined8 *)malloc(0x10);
  if (puVar6 == (undefined8 *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = dup2;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_248.sites_.
  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  *puVar6 = 0;
  puVar6[1] = 1;
  local_248.dim_ = (size_t)puVar6;
  lattice::unitcell::add_bond(&local_150,0,0,(offset_t *)&local_248,1);
  free((void *)local_248.dim_);
  local_1c8.m_data = (long *)0x0;
  local_1c8.m_rows = 0;
  local_1c8.m_cols = 0;
  Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::resize(&local_1c8,4,2,2);
  if (0 < local_1c8.m_cols * local_1c8.m_rows) {
    memset(local_1c8.m_data,0,local_1c8.m_cols * local_1c8.m_rows * 8);
  }
  *local_1c8.m_data = (ulong)this & 0xffffffff;
  local_1c8.m_data[local_1c8.m_rows + 1] = (ulong)Lx;
  lattice::graph::graph(&local_248,&local_168,&local_150,(span_t *)&local_1c8,periodic);
  free(local_1c8.m_data);
  if ((ulong)(((long)local_248.sites_.
                     super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_248.sites_.
                     super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) < 0x20) {
    local_1e0 = (fvar<double,_2UL> *)__return_storage_ptr__;
    pdVar7 = (double *)operator_new(0x10);
    *pdVar7 = 0.0;
    pdVar7[1] = 0.0;
    *pdVar7 = (double)local_1f8._0_8_;
    uVar20 = local_1f8._12_4_;
    pdVar7[1] = Jy;
    local_1e8 = (double)(Lx * iVar17);
    local_1f8._8_4_ = local_1f8._8_4_;
    local_1f8._0_8_ = -((double)local_1f8._0_8_ + Jy) * local_1e8;
    local_1f8._12_4_ = uVar20 ^ 0x80000000;
    uVar13 = (long)local_248.sites_.
                   super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_248.sites_.
                   super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    local_198 = 0;
    uStack_190 = 0;
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_1c8.m_cols = 0;
    uStack_1b0 = 0;
    local_1c8.m_data = (long *)0x0;
    local_1c8.m_rows = 0;
    local_188 = 0;
    dVar2 = h.v._M_elems[0].v._M_elems[2];
    auVar1._8_8_ = -(ulong)(dVar2 != 0.0);
    auVar1._0_8_ = -(ulong)(h.v._M_elems[0].v._M_elems[1] != 0.0);
    uVar21 = movmskpd(iVar17,auVar1);
    local_178._0_8_ = h.v._M_elems[0].v._M_elems[1];
    local_178._8_8_ = h.v._M_elems[0].v._M_elems[2];
    local_118._8_4_ = fVar5.v._M_elems[0].v._M_elems[2]._0_4_;
    local_118._0_8_ = dVar2;
    local_118._12_4_ = fVar5.v._M_elems[0].v._M_elems[2]._4_4_;
    uVar20 = 0;
    this_00 = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul> *)
              local_78;
    do {
      dVar2 = 0.0;
      dVar24 = 0.0;
      if ((long)local_248.bonds_.
                super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_248.bonds_.
                super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        uVar14 = ((long)local_248.bonds_.
                        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_248.bonds_.
                        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        piVar8 = &(local_248.bonds_.
                   super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type;
        uVar9 = 1;
        do {
          dVar3 = (double)((uVar20 >> ((uint)((bond_t *)(piVar8 + -4))->source & 0x1f) & 1) != 0);
          dVar4 = (double)((uVar20 >> ((uint)*(size_t *)(piVar8 + -2) & 0x1f) & 1) != 0);
          dVar24 = dVar24 - (dVar3 + dVar3 + -1.0) * pdVar7[*piVar8] * (dVar4 + dVar4 + -1.0);
          piVar8 = piVar8 + 6;
          bVar22 = uVar9 <= uVar14;
          lVar10 = uVar14 - uVar9;
          uVar9 = (ulong)((int)uVar9 + 1);
        } while (bVar22 && lVar10 != 0);
      }
      if ((long)local_248.sites_.
                super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_248.sites_.
                super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        uVar9 = ((long)local_248.sites_.
                       super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_248.sites_.
                       super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        dVar2 = 0.0;
        uVar14 = 0;
        do {
          dVar3 = (double)((uVar20 >> ((uint)uVar14 & 0x1f) & 1) != 0);
          dVar2 = dVar2 + dVar3 + dVar3 + -1.0;
          uVar14 = (ulong)((uint)uVar14 + 1);
        } while (uVar14 <= uVar9 && uVar9 - uVar14 != 0);
      }
      dVar3 = local_178._0_8_;
      if ((uVar21 & 1) != 0) {
        dVar3 = dVar2 * dVar3;
      }
      dVar4 = local_178._8_8_;
      if ((byte)((byte)uVar21 >> 1) != 0) {
        dVar4 = dVar2 * (double)local_118._0_8_;
      }
      local_108._0_8_ = dVar2 * h.v._M_elems[0].v._M_elems[0];
      local_108._16_4_ = SUB84(dVar4,0);
      local_108._8_8_ = dVar3;
      local_108._20_4_ = (int)((ulong)dVar4 >> 0x20);
      lVar10 = 0;
      do {
        *(ulong *)(local_108 + lVar10) = *(ulong *)(local_108 + lVar10) ^ 0x8000000000000000;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      local_108._0_8_ = ((double)local_1f8._0_8_ - dVar24) + (double)local_108._0_8_;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>::operator*
                ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> *)
                 local_108,&beta);
      local_1d0 = exp(local_78[0]);
      local_1d8.d0 = &local_1d0;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::
      apply_derivatives<boost::math::differentiation::autodiff_v1::detail::exp<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>(boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>const&)::_lambda(unsigned_long)_1_>
                ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
                 &local_c0,this_00,4,&local_1d8);
      pDVar15 = &local_1c8;
      lVar10 = 0;
      pfVar11 = (fvar<double,_2UL> *)&local_c0;
      do {
        lVar18 = 0;
        do {
          (&pDVar15->m_data)[lVar18] =
               (long *)(((array<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_3UL>
                          *)&pfVar11->v)->_M_elems[0].v._M_elems[lVar18] +
                       (double)(&pDVar15->m_data)[lVar18]);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        lVar10 = lVar10 + 1;
        pDVar15 = pDVar15 + 1;
        pfVar11 = pfVar11 + 1;
      } while (lVar10 != 3);
      uVar20 = uVar20 + 1;
    } while (uVar20 >> ((char)(uVar13 >> 3) * -0x49 & 0x1fU) == 0);
    boost::math::differentiation::autodiff_v1::detail::
    log<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
              ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               local_108,(detail *)&local_1c8,
               (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               0x3);
    pfVar11 = local_1e0;
    puVar6 = (undefined8 *)local_108;
    pfVar19 = this_00;
    for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined8 *)pfVar19 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar23 * -2 + 1;
      pfVar19 = pfVar19 + (ulong)bVar23 * -0x10 + 8;
    }
    lVar10 = 0;
    do {
      lVar18 = 0;
      do {
        *(ulong *)(this_00 + lVar18) = *(ulong *)(this_00 + lVar18) ^ 0x8000000000000000;
        lVar18 = lVar18 + 8;
      } while (lVar18 != 0x18);
      lVar10 = lVar10 + 0x18;
      this_00 = this_00 + 0x18;
    } while (lVar10 != 0x48);
    boost::math::differentiation::autodiff_v1::detail::
    fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::operator/
              (&local_c0,
               (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul> *)
               local_78,&beta);
    *(double *)((long)(pfVar11 + 2) + 8) = local_c0.v._M_elems[2].v._M_elems[1];
    *(double *)((long)(pfVar11 + 2) + 0x10) = local_c0.v._M_elems[2].v._M_elems[2];
    pfVar11[1].v._M_elems[2] = local_c0.v._M_elems[1].v._M_elems[2];
    *(double *)(pfVar11 + 2) = local_c0.v._M_elems[2].v._M_elems[0];
    pfVar11[1].v._M_elems[0] = local_c0.v._M_elems[1].v._M_elems[0];
    pfVar11[1].v._M_elems[1] = local_c0.v._M_elems[1].v._M_elems[1];
    (pfVar11->v)._M_elems[1] = local_c0.v._M_elems[0].v._M_elems[1];
    (pfVar11->v)._M_elems[2] = local_c0.v._M_elems[0].v._M_elems[2];
    (pfVar11->v)._M_elems[0] = (double)local_1f8._0_8_ + local_c0.v._M_elems[0].v._M_elems[0];
    lVar10 = 0;
    pfVar16 = pfVar11;
    do {
      lVar18 = 0;
      do {
        *(double *)
         ((long)((array<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_3UL> *
                 )&pfVar16->v)->_M_elems[0].v._M_elems + lVar18) =
             *(double *)
              ((long)((array<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_3UL>
                       *)&pfVar16->v)->_M_elems[0].v._M_elems + lVar18) / local_1e8;
        lVar18 = lVar18 + 8;
      } while (lVar18 != 0x18);
      lVar10 = lVar10 + 0x18;
      pfVar16 = pfVar16 + 1;
    } while (lVar10 != 0x48);
    operator_delete(pdVar7,0x10);
    if (local_248.bonds_.
        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.bonds_.
                      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.bonds_.
                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.bonds_.
                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_248.coordinates_);
    std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
              (&local_248.sites_);
    std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::~vector
              (&local_150.bonds_);
    std::vector<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>::~vector
              (&local_150.sites_);
    free(local_168.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_data);
    return (promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
            *)pfVar11;
  }
  piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar12,"too large system size");
  __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline boost::math::differentiation::promote<U, W> finite_count(I Lx, I Ly,
                                                                T Jx, T Jy,
                                                                U beta, W h) {
  typedef I int_t;
  typedef T real_t;
  typedef boost::math::differentiation::promote<U, W> value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));

  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 1);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_sites() >= 32)
    throw(std::invalid_argument("too large system size"));

  std::vector<real_t> J(2);
  J[0] = Jx;
  J[1] = Jy;
  real_t gs_energy = -(Jx + Jy) * (Lx * Ly);
  int_t num_states = 1 << graph.num_sites();
  value_t Z(0);
  for (int_t c = 0; c < num_states; ++c) {
    real_t energy = 0;
    for (int_t b = 0; b < graph.num_bonds(); ++b) {
      real_t ci = real_t(2) * ((c >> graph.source(b)) & 1) - 1;
      real_t cj = real_t(2) * ((c >> graph.target(b)) & 1) - 1;
      energy -= J[graph.bond_type(b)] * ci * cj;
    }
    real_t mag = 0;
    for (int_t s = 0; s < graph.num_sites(); ++s) {
      mag += real_t(2) * ((c >> s) & 1) - 1;
    }
    Z += exp((gs_energy - energy - h * mag) * beta);
  }
  return (-log(Z) / beta + gs_energy) / (Lx * Ly);
}